

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

size_t __thiscall
google::protobuf::internal::ExtensionSet::Extension::MessageSetItemByteSize
          (Extension *this,int number)

{
  FieldType FVar1;
  type_info *ptVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  LogMessage *other;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar6;
  long lVar7;
  long lVar8;
  void *in_RDX;
  ulong uVar9;
  size_t sVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  LogFinisher LStack_51;
  LogMessage LStack_50;
  
  if ((this->type == '\v') && (this->is_repeated != true)) {
    if ((this->field_0xa & 1) == 0) {
      uVar13 = number | 1;
      iVar5 = 0x1f;
      if (uVar13 != 0) {
        for (; uVar13 >> iVar5 == 0; iVar5 = iVar5 + -1) {
        }
      }
      lVar7 = (**(code **)(*(long *)(this->field_0).repeated_string_value + 0x58))
                        ((type_info *)(this->field_0).repeated_string_value,(ulong)uVar13,in_RDX);
      uVar13 = (uint)lVar7 | 1;
      iVar4 = 0x1f;
      if (uVar13 != 0) {
        for (; uVar13 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      sVar10 = (ulong)(iVar5 * 9 + 0x49U >> 6) + 4 + lVar7 + (ulong)(iVar4 * 9 + 0x49U >> 6);
    }
    else {
      sVar10 = 0;
    }
    return sVar10;
  }
  if (this->is_repeated != true) {
    if ((this->field_0xa & 1) != 0) {
      return 0;
    }
    uVar12 = (uint)this->type;
    uVar11 = number * 8 + 1;
    uVar13 = 0x1f;
    if (uVar11 != 0) {
      for (; uVar11 >> uVar13 == 0; uVar13 = uVar13 - 1) {
      }
    }
    uVar14 = (ulong)uVar13;
    sVar10 = (ulong)(uVar13 * 9 + 0x49 >> 6) << (uVar12 == 10);
    if (0x11 < uVar12 - 1) {
      return sVar10;
    }
    switch(uVar12) {
    default:
      return sVar10 + 8;
    case 2:
    case 7:
    case 0xf:
      return sVar10 + 4;
    case 3:
    case 4:
      uVar14 = (this->field_0).uint64_value;
      goto LAB_002be157;
    case 5:
    case 0xe:
      uVar14 = (ulong)(uint)(this->field_0).int32_value;
      if ((this->field_0).int32_value < 0) {
        uVar14 = 10;
        goto LAB_002be320;
      }
      break;
    case 8:
      return sVar10 + 1;
    case 9:
    case 0xc:
      uVar14 = ((this->field_0).string_value)->_M_string_length;
      goto LAB_002be30e;
    case 10:
      uVar14 = (**(code **)(*(long *)(this->field_0).repeated_string_value + 0x58))
                         ((type_info *)(this->field_0).repeated_string_value,uVar14,
                          (void *)((long)&switchD_002bdd6e::switchdataD_0059d948 +
                                  (long)(int)(&switchD_002bdd6e::switchdataD_0059d948)[uVar12 - 1]))
      ;
      goto LAB_002be320;
    case 0xb:
      ptVar2 = (type_info *)(this->field_0).repeated_string_value;
      if ((this->field_0xa & 0x10) == 0) {
        uVar14 = (**(code **)(*(long *)ptVar2 + 0x58))
                           (ptVar2,uVar14,
                            (void *)((long)&switchD_002bdd6e::switchdataD_0059d948 +
                                    (long)(int)(&switchD_002bdd6e::switchdataD_0059d948)[uVar12 - 1]
                                    ));
      }
      else {
        iVar5 = (**(code **)(*(long *)ptVar2 + 0x50))(ptVar2,uVar14);
        uVar14 = (ulong)iVar5;
      }
LAB_002be30e:
      sVar10 = sVar10 + uVar14;
      break;
    case 0xd:
      uVar14 = (ulong)(this->field_0).uint32_value;
      break;
    case 0x11:
      uVar13 = (this->field_0).int32_value >> 0x1f ^ (this->field_0).int32_value * 2 | 1;
      iVar5 = 0x1f;
      if (uVar13 != 0) {
        for (; uVar13 >> iVar5 == 0; iVar5 = iVar5 + -1) {
        }
      }
      goto LAB_002be317;
    case 0x12:
      uVar14 = (this->field_0).int64_value >> 0x3f ^ (this->field_0).int64_value * 2;
LAB_002be157:
      lVar7 = 0x3f;
      if ((uVar14 | 1) != 0) {
        for (; (uVar14 | 1) >> lVar7 == 0; lVar7 = lVar7 + -1) {
        }
      }
      iVar5 = (int)lVar7;
      goto LAB_002be317;
    }
    uVar13 = (uint)uVar14 | 1;
    iVar5 = 0x1f;
    if (uVar13 != 0) {
      for (; uVar13 >> iVar5 == 0; iVar5 = iVar5 + -1) {
      }
    }
LAB_002be317:
    uVar14 = (ulong)(iVar5 * 9 + 0x49U >> 6);
LAB_002be320:
    return sVar10 + uVar14;
  }
  FVar1 = this->type;
  if (this->is_packed == true) {
    switch(FVar1) {
    case '\x01':
    case '\x06':
    case '\x10':
      uVar9 = (ulong)(uint)((this->field_0).repeated_int32_value)->current_size_ << 3;
      break;
    case '\x02':
    case '\a':
    case '\x0f':
      uVar9 = (ulong)(uint)((this->field_0).repeated_int32_value)->current_size_ << 2;
      break;
    case '\x03':
      lVar7 = (long)((this->field_0).repeated_int32_value)->current_size_;
      if (lVar7 < 1) goto switchD_002bdc99_default;
      lVar8 = 0;
      uVar9 = 0;
      do {
        uVar14 = *(ulong *)((long)((this->field_0).repeated_int32_value)->arena_or_elements_ +
                           lVar8 * 8) | 1;
        lVar3 = 0x3f;
        if (uVar14 != 0) {
          for (; uVar14 >> lVar3 == 0; lVar3 = lVar3 + -1) {
          }
        }
        uVar9 = uVar9 + ((int)lVar3 * 9 + 0x49U >> 6);
        lVar8 = lVar8 + 1;
      } while (lVar7 != lVar8);
      break;
    case '\x04':
      lVar7 = (long)((this->field_0).repeated_int32_value)->current_size_;
      if (lVar7 < 1) goto switchD_002bdc99_default;
      lVar8 = 0;
      uVar9 = 0;
      do {
        uVar14 = *(ulong *)((long)((this->field_0).repeated_int32_value)->arena_or_elements_ +
                           lVar8 * 8) | 1;
        lVar3 = 0x3f;
        if (uVar14 != 0) {
          for (; uVar14 >> lVar3 == 0; lVar3 = lVar3 + -1) {
          }
        }
        uVar9 = uVar9 + ((int)lVar3 * 9 + 0x49U >> 6);
        lVar8 = lVar8 + 1;
      } while (lVar7 != lVar8);
      break;
    case '\x05':
      lVar7 = (long)((this->field_0).repeated_int32_value)->current_size_;
      if (lVar7 < 1) goto switchD_002bdc99_default;
      lVar8 = 0;
      uVar9 = 0;
      do {
        uVar13 = *(uint *)((long)((this->field_0).repeated_int32_value)->arena_or_elements_ +
                          lVar8 * 4);
        if ((int)uVar13 < 0) {
          uVar14 = 10;
        }
        else {
          uVar13 = uVar13 | 1;
          iVar5 = 0x1f;
          if (uVar13 != 0) {
            for (; uVar13 >> iVar5 == 0; iVar5 = iVar5 + -1) {
            }
          }
          uVar14 = (ulong)(iVar5 * 9 + 0x49U >> 6);
        }
        uVar9 = uVar9 + uVar14;
        lVar8 = lVar8 + 1;
      } while (lVar7 != lVar8);
      break;
    case '\b':
      uVar9 = (ulong)(uint)((this->field_0).repeated_int32_value)->current_size_;
      break;
    case '\t':
    case '\n':
    case '\v':
    case '\f':
      LogMessage::LogMessage
                (&LStack_50,LOGLEVEL_FATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x646);
      other = LogMessage::operator<<(&LStack_50,"Non-primitive types can\'t be packed.");
      LogFinisher::operator=(&LStack_51,other);
      LogMessage::~LogMessage(&LStack_50);
    default:
switchD_002bdc99_default:
      this->cached_size = 0;
      return 0;
    case '\r':
      lVar7 = (long)((this->field_0).repeated_int32_value)->current_size_;
      if (lVar7 < 1) goto switchD_002bdc99_default;
      lVar8 = 0;
      uVar9 = 0;
      do {
        uVar13 = *(uint *)((long)((this->field_0).repeated_int32_value)->arena_or_elements_ +
                          lVar8 * 4) | 1;
        iVar5 = 0x1f;
        if (uVar13 != 0) {
          for (; uVar13 >> iVar5 == 0; iVar5 = iVar5 + -1) {
          }
        }
        uVar9 = uVar9 + (iVar5 * 9 + 0x49U >> 6);
        lVar8 = lVar8 + 1;
      } while (lVar7 != lVar8);
      break;
    case '\x0e':
      lVar7 = (long)((this->field_0).repeated_int32_value)->current_size_;
      if (lVar7 < 1) goto switchD_002bdc99_default;
      lVar8 = 0;
      uVar9 = 0;
      do {
        uVar13 = *(uint *)((long)((this->field_0).repeated_int32_value)->arena_or_elements_ +
                          lVar8 * 4);
        if ((int)uVar13 < 0) {
          uVar14 = 10;
        }
        else {
          uVar13 = uVar13 | 1;
          iVar5 = 0x1f;
          if (uVar13 != 0) {
            for (; uVar13 >> iVar5 == 0; iVar5 = iVar5 + -1) {
            }
          }
          uVar14 = (ulong)(iVar5 * 9 + 0x49U >> 6);
        }
        uVar9 = uVar9 + uVar14;
        lVar8 = lVar8 + 1;
      } while (lVar7 != lVar8);
      break;
    case '\x11':
      lVar7 = (long)((this->field_0).repeated_int32_value)->current_size_;
      if (lVar7 < 1) goto switchD_002bdc99_default;
      lVar8 = 0;
      uVar9 = 0;
      do {
        iVar5 = *(int *)((long)((this->field_0).repeated_int32_value)->arena_or_elements_ +
                        lVar8 * 4);
        uVar13 = iVar5 >> 0x1f ^ iVar5 * 2 | 1;
        iVar5 = 0x1f;
        if (uVar13 != 0) {
          for (; uVar13 >> iVar5 == 0; iVar5 = iVar5 + -1) {
          }
        }
        uVar9 = uVar9 + (iVar5 * 9 + 0x49U >> 6);
        lVar8 = lVar8 + 1;
      } while (lVar7 != lVar8);
      break;
    case '\x12':
      lVar7 = (long)((this->field_0).repeated_int32_value)->current_size_;
      if (lVar7 < 1) goto switchD_002bdc99_default;
      lVar8 = 0;
      uVar9 = 0;
      do {
        lVar3 = *(long *)((long)((this->field_0).repeated_int32_value)->arena_or_elements_ +
                         lVar8 * 8);
        uVar14 = lVar3 >> 0x3f ^ lVar3 * 2 | 1;
        lVar3 = 0x3f;
        if (uVar14 != 0) {
          for (; uVar14 >> lVar3 == 0; lVar3 = lVar3 + -1) {
          }
        }
        uVar9 = uVar9 + ((int)lVar3 * 9 + 0x49U >> 6);
        lVar8 = lVar8 + 1;
      } while (lVar7 != lVar8);
    }
    this->cached_size = (uint)uVar9;
    if (uVar9 == 0) {
LAB_002be323:
      return 0;
    }
    uVar13 = (uint)uVar9 | 1;
    iVar5 = 0x1f;
    if (uVar13 != 0) {
      for (; uVar13 >> iVar5 == 0; iVar5 = iVar5 + -1) {
      }
    }
    uVar14 = (ulong)(iVar5 * 9 + 0x49U >> 6);
    uVar13 = number * 8 + 3;
    iVar5 = 0x1f;
    if (uVar13 != 0) {
      for (; uVar13 >> iVar5 == 0; iVar5 = iVar5 + -1) {
      }
    }
    sVar10 = uVar9 + (iVar5 * 9 + 0x49U >> 6);
    goto LAB_002be320;
  }
  uVar13 = number * 8 + 1;
  iVar5 = 0x1f;
  if (uVar13 != 0) {
    for (; uVar13 >> iVar5 == 0; iVar5 = iVar5 + -1) {
    }
  }
  lVar7 = (ulong)(iVar5 * 9 + 0x49U >> 6) << (FVar1 == '\n');
  switch(FVar1) {
  case '\x01':
  case '\x06':
  case '\x10':
    lVar7 = lVar7 + 8;
    goto LAB_002bdf8b;
  case '\x02':
  case '\a':
  case '\x0f':
    lVar7 = lVar7 + 4;
    goto LAB_002bdf8b;
  case '\x03':
    uVar13 = ((this->field_0).repeated_int32_value)->current_size_;
    sVar10 = lVar7 * (ulong)uVar13;
    if (0 < (int)uVar13) {
      uVar14 = 0;
      do {
        uVar9 = *(ulong *)((long)((this->field_0).repeated_int32_value)->arena_or_elements_ +
                          uVar14 * 8) | 1;
        lVar7 = 0x3f;
        if (uVar9 != 0) {
          for (; uVar9 >> lVar7 == 0; lVar7 = lVar7 + -1) {
          }
        }
        sVar10 = sVar10 + ((int)lVar7 * 9 + 0x49U >> 6);
        uVar14 = uVar14 + 1;
      } while (uVar13 != uVar14);
    }
    break;
  case '\x04':
    uVar13 = ((this->field_0).repeated_int32_value)->current_size_;
    sVar10 = lVar7 * (ulong)uVar13;
    if (0 < (int)uVar13) {
      uVar14 = 0;
      do {
        uVar9 = *(ulong *)((long)((this->field_0).repeated_int32_value)->arena_or_elements_ +
                          uVar14 * 8) | 1;
        lVar7 = 0x3f;
        if (uVar9 != 0) {
          for (; uVar9 >> lVar7 == 0; lVar7 = lVar7 + -1) {
          }
        }
        sVar10 = sVar10 + ((int)lVar7 * 9 + 0x49U >> 6);
        uVar14 = uVar14 + 1;
      } while (uVar13 != uVar14);
    }
    break;
  case '\x05':
    uVar13 = ((this->field_0).repeated_int32_value)->current_size_;
    sVar10 = lVar7 * (ulong)uVar13;
    if (0 < (int)uVar13) {
      uVar14 = 0;
      do {
        uVar12 = *(uint *)((long)((this->field_0).repeated_int32_value)->arena_or_elements_ +
                          uVar14 * 4);
        if ((int)uVar12 < 0) {
          uVar9 = 10;
        }
        else {
          uVar12 = uVar12 | 1;
          iVar5 = 0x1f;
          if (uVar12 != 0) {
            for (; uVar12 >> iVar5 == 0; iVar5 = iVar5 + -1) {
            }
          }
          uVar9 = (ulong)(iVar5 * 9 + 0x49U >> 6);
        }
        sVar10 = sVar10 + uVar9;
        uVar14 = uVar14 + 1;
      } while (uVar13 != uVar14);
    }
    break;
  case '\b':
    lVar7 = lVar7 + 1;
LAB_002bdf8b:
    sVar10 = lVar7 * (ulong)(uint)((this->field_0).repeated_int32_value)->current_size_;
    break;
  case '\t':
    uVar13 = (((this->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).current_size_;
    sVar10 = lVar7 * (ulong)uVar13;
    if (0 < (int)uVar13) {
      uVar14 = 0;
      do {
        lVar7 = *(long *)((long)((((this->field_0).repeated_string_value)->
                                 super_RepeatedPtrFieldBase).rep_)->elements[uVar14] + 8);
        uVar12 = (uint)lVar7 | 1;
        iVar5 = 0x1f;
        if (uVar12 != 0) {
          for (; uVar12 >> iVar5 == 0; iVar5 = iVar5 + -1) {
          }
        }
        sVar10 = sVar10 + lVar7 + (ulong)(iVar5 * 9 + 0x49U >> 6);
        uVar14 = uVar14 + 1;
      } while (uVar13 != uVar14);
    }
    break;
  case '\n':
    pRVar6 = (this->field_0).repeated_string_value;
    uVar13 = (pRVar6->super_RepeatedPtrFieldBase).current_size_;
    sVar10 = lVar7 * (ulong)uVar13;
    if (0 < (int)uVar13) {
      lVar7 = 0;
      do {
        lVar8 = (**(code **)(*((pRVar6->super_RepeatedPtrFieldBase).rep_)->elements[lVar7] + 0x58))
                          ();
        sVar10 = sVar10 + lVar8;
        lVar7 = lVar7 + 1;
        pRVar6 = (this->field_0).repeated_string_value;
      } while (lVar7 < (pRVar6->super_RepeatedPtrFieldBase).current_size_);
    }
    break;
  case '\v':
    pRVar6 = (this->field_0).repeated_string_value;
    uVar13 = (pRVar6->super_RepeatedPtrFieldBase).current_size_;
    sVar10 = lVar7 * (ulong)uVar13;
    if (0 < (int)uVar13) {
      lVar7 = 0;
      do {
        lVar8 = (**(code **)(*((pRVar6->super_RepeatedPtrFieldBase).rep_)->elements[lVar7] + 0x58))
                          ();
        uVar13 = (uint)lVar8 | 1;
        iVar5 = 0x1f;
        if (uVar13 != 0) {
          for (; uVar13 >> iVar5 == 0; iVar5 = iVar5 + -1) {
          }
        }
        sVar10 = sVar10 + lVar8 + (ulong)(iVar5 * 9 + 0x49U >> 6);
        lVar7 = lVar7 + 1;
        pRVar6 = (this->field_0).repeated_string_value;
      } while (lVar7 < (pRVar6->super_RepeatedPtrFieldBase).current_size_);
    }
    break;
  case '\f':
    uVar13 = (((this->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).current_size_;
    sVar10 = lVar7 * (ulong)uVar13;
    if (0 < (int)uVar13) {
      uVar14 = 0;
      do {
        lVar7 = *(long *)((long)((((this->field_0).repeated_string_value)->
                                 super_RepeatedPtrFieldBase).rep_)->elements[uVar14] + 8);
        uVar12 = (uint)lVar7 | 1;
        iVar5 = 0x1f;
        if (uVar12 != 0) {
          for (; uVar12 >> iVar5 == 0; iVar5 = iVar5 + -1) {
          }
        }
        sVar10 = sVar10 + lVar7 + (ulong)(iVar5 * 9 + 0x49U >> 6);
        uVar14 = uVar14 + 1;
      } while (uVar13 != uVar14);
    }
    break;
  case '\r':
    uVar13 = ((this->field_0).repeated_int32_value)->current_size_;
    sVar10 = lVar7 * (ulong)uVar13;
    if (0 < (int)uVar13) {
      uVar14 = 0;
      do {
        uVar12 = *(uint *)((long)((this->field_0).repeated_int32_value)->arena_or_elements_ +
                          uVar14 * 4) | 1;
        iVar5 = 0x1f;
        if (uVar12 != 0) {
          for (; uVar12 >> iVar5 == 0; iVar5 = iVar5 + -1) {
          }
        }
        sVar10 = sVar10 + (iVar5 * 9 + 0x49U >> 6);
        uVar14 = uVar14 + 1;
      } while (uVar13 != uVar14);
    }
    break;
  case '\x0e':
    uVar13 = ((this->field_0).repeated_int32_value)->current_size_;
    sVar10 = lVar7 * (ulong)uVar13;
    if (0 < (int)uVar13) {
      uVar14 = 0;
      do {
        uVar12 = *(uint *)((long)((this->field_0).repeated_int32_value)->arena_or_elements_ +
                          uVar14 * 4);
        if ((int)uVar12 < 0) {
          uVar9 = 10;
        }
        else {
          uVar12 = uVar12 | 1;
          iVar5 = 0x1f;
          if (uVar12 != 0) {
            for (; uVar12 >> iVar5 == 0; iVar5 = iVar5 + -1) {
            }
          }
          uVar9 = (ulong)(iVar5 * 9 + 0x49U >> 6);
        }
        sVar10 = sVar10 + uVar9;
        uVar14 = uVar14 + 1;
      } while (uVar13 != uVar14);
    }
    break;
  case '\x11':
    uVar13 = ((this->field_0).repeated_int32_value)->current_size_;
    sVar10 = lVar7 * (ulong)uVar13;
    if (0 < (int)uVar13) {
      uVar14 = 0;
      do {
        iVar5 = *(int *)((long)((this->field_0).repeated_int32_value)->arena_or_elements_ +
                        uVar14 * 4);
        uVar12 = iVar5 >> 0x1f ^ iVar5 * 2 | 1;
        iVar5 = 0x1f;
        if (uVar12 != 0) {
          for (; uVar12 >> iVar5 == 0; iVar5 = iVar5 + -1) {
          }
        }
        sVar10 = sVar10 + (iVar5 * 9 + 0x49U >> 6);
        uVar14 = uVar14 + 1;
      } while (uVar13 != uVar14);
    }
    break;
  case '\x12':
    uVar13 = ((this->field_0).repeated_int32_value)->current_size_;
    sVar10 = lVar7 * (ulong)uVar13;
    if (0 < (int)uVar13) {
      uVar14 = 0;
      do {
        lVar7 = *(long *)((long)((this->field_0).repeated_int32_value)->arena_or_elements_ +
                         uVar14 * 8);
        uVar9 = lVar7 >> 0x3f ^ lVar7 * 2 | 1;
        lVar7 = 0x3f;
        if (uVar9 != 0) {
          for (; uVar9 >> lVar7 == 0; lVar7 = lVar7 + -1) {
          }
        }
        sVar10 = sVar10 + ((int)lVar7 * 9 + 0x49U >> 6);
        uVar14 = uVar14 + 1;
      } while (uVar13 != uVar14);
    }
    break;
  default:
    goto LAB_002be323;
  }
  return sVar10;
}

Assistant:

size_t ExtensionSet::Extension::MessageSetItemByteSize(int number) const {
  if (type != WireFormatLite::TYPE_MESSAGE || is_repeated) {
    // Not a valid MessageSet extension, but compute the byte size for it the
    // normal way.
    return ByteSize(number);
  }

  if (is_cleared) return 0;

  size_t our_size = WireFormatLite::kMessageSetItemTagsSize;

  // type_id
  our_size += io::CodedOutputStream::VarintSize32(number);

  // message
  size_t message_size = 0;
  if (is_lazy) {
    message_size = lazymessage_value->ByteSizeLong();
  } else {
    message_size = message_value->ByteSizeLong();
  }

  our_size += io::CodedOutputStream::VarintSize32(message_size);
  our_size += message_size;

  return our_size;
}